

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_gprim_predefined<tinyusdz::GeomCamera>
                   (string *__return_storage_ptr__,GeomCamera *gprim,uint32_t indent)

{
  uint32_t indent_00;
  string *psVar1;
  uint32_t in_R9D;
  stringstream ss;
  ListEditQual local_208;
  allocator local_201;
  string local_200;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::__cxx11::string::string((string *)&local_1d8,"doubleSided",(allocator *)&local_208);
  print_typed_attr<bool>(&local_200,&(gprim->super_GPrim).doubleSided,&local_1d8,indent);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"orientation",(allocator *)&local_208);
  print_typed_token_attr<tinyusdz::Orientation>
            (&local_200,&(gprim->super_GPrim).orientation,&local_1d8,indent);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"purpose",(allocator *)&local_208);
  print_typed_token_attr<tinyusdz::Purpose>
            (&local_200,&(gprim->super_GPrim).purpose,&local_1d8,indent);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"extent",(allocator *)&local_208);
  print_typed_attr<tinyusdz::Extent>(&local_200,&(gprim->super_GPrim).extent,&local_1d8,indent);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)&local_1d8,"visibility",(allocator *)&local_208);
  indent_00 = indent;
  print_typed_token_attr<tinyusdz::Visibility>
            (&local_200,&(gprim->super_GPrim).visibility,&local_1d8,indent);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_material_binding_abi_cxx11_
            (&local_200,(tinyusdz *)&(gprim->super_GPrim).super_MaterialBinding,
             (MaterialBinding *)(ulong)indent,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  print_collection_abi_cxx11_
            (&local_200,(tinyusdz *)&(gprim->super_GPrim).super_Collection,
             (Collection *)(ulong)indent,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  if ((gprim->super_GPrim).proxyPrim._authored == true) {
    local_208 = (gprim->super_GPrim).proxyPrim._relationship.listOpQual;
    psVar1 = &local_1d8;
    ::std::__cxx11::string::string((string *)psVar1,"proxyPrim",&local_201);
    anon_unknown_173::print_relationship
              (&local_200,&(gprim->super_GPrim).proxyPrim._relationship,&local_208,SUB81(psVar1,0),
               (string *)(ulong)indent,in_R9D);
    indent_00 = (uint32_t)psVar1;
    ::std::operator<<(local_1a8,(string *)&local_200);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  print_xformOps_abi_cxx11_
            (&local_200,(tinyusdz *)gprim,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)indent,
             indent_00);
  ::std::operator<<(local_1a8,(string *)&local_200);
  ::std::__cxx11::string::_M_dispose();
  psVar1 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

std::string print_gprim_predefined(const T &gprim, const uint32_t indent) {
  std::stringstream ss;

  // properties
  ss << print_typed_attr(gprim.doubleSided, "doubleSided", indent);
  ss << print_typed_token_attr(gprim.orientation, "orientation", indent);
  ss << print_typed_token_attr(gprim.purpose, "purpose", indent);
  ss << print_typed_attr(gprim.extent, "extent", indent);

  ss << print_typed_token_attr(gprim.visibility, "visibility", indent);

  ss << print_material_binding(&gprim, indent);

  ss << print_collection(&gprim, indent);

  if (gprim.proxyPrim.authored()) {
    const Relationship &rel = gprim.proxyPrim.relationship();
    ss << print_relationship(rel, rel.get_listedit_qual(), /* custom */ false,
                             "proxyPrim", indent);
  }

  ss << print_xformOps(gprim.xformOps, indent);

  return ss.str();
}